

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall CGL::Application::load(Application *this,SceneInfo *sceneInfo)

{
  double dVar1;
  double dVar2;
  Vector3D VVar3;
  Vector3D VVar4;
  undefined1 uVar5;
  size_type sVar6;
  Scene *defaultStyle;
  vector<CGL::Collada::Node,_std::allocator<CGL::Collada::Node>_> *in_RSI;
  Application *in_RDI;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double max_view_distance;
  double min_view_distance;
  double view_distance;
  Vector3D target;
  BBox *bbox;
  Matrix4x4 *transform;
  Instance *instance;
  Node *node;
  int i;
  int len;
  Vector3D c_dir;
  Vector3D c_pos;
  CameraInfo *c;
  vector<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_> objects;
  vector<CGL::GLScene::SceneLight_*,_std::allocator<CGL::GLScene::SceneLight_*>_> lights;
  vector<CGL::Collada::Node,_std::allocator<CGL::Collada::Node>_> *nodes;
  Vector4D *in_stack_fffffffffffffca8;
  Matrix4x4 *in_stack_fffffffffffffcb0;
  Camera *pCVar11;
  CameraInfo *in_stack_fffffffffffffcb8;
  Application *in_stack_fffffffffffffcc0;
  PolymeshInfo *in_stack_fffffffffffffcc8;
  undefined7 in_stack_fffffffffffffcd0;
  undefined1 in_stack_fffffffffffffcd7;
  Scene *in_stack_fffffffffffffce0;
  BBox *in_stack_fffffffffffffce8;
  LightInfo *in_stack_fffffffffffffcf0;
  Application *in_stack_fffffffffffffcf8;
  Matrix4x4 *in_stack_fffffffffffffd00;
  Matrix4x4 *pMVar12;
  Vector3D local_2e8;
  undefined8 in_stack_fffffffffffffd48;
  Vector3D local_288;
  undefined8 in_stack_fffffffffffffdb0;
  undefined8 in_stack_fffffffffffffdb8;
  Matrix4x4 *in_stack_fffffffffffffe10;
  SphereInfo *in_stack_fffffffffffffe18;
  Application *in_stack_fffffffffffffe20;
  Vector4D local_1a8 [3];
  double local_148;
  double dStack_140;
  double dStack_138;
  undefined8 uStack_130;
  Vector4D local_128 [2];
  double local_e8;
  double dStack_e0;
  double dStack_d8;
  undefined8 uStack_d0;
  Application *local_c8;
  MaterialInfo *local_c0;
  reference local_b8;
  int local_b0;
  int local_ac;
  anon_union_32_3_e2189aaa_for_Vector3D_0 local_a8;
  anon_union_32_3_e2189aaa_for_Vector3D_0 local_78;
  MaterialInfo *local_50;
  vector<CGL::Collada::Node,_std::allocator<CGL::Collada::Node>_> *local_18;
  
  local_18 = in_RSI;
  std::vector<CGL::GLScene::SceneLight_*,_std::allocator<CGL::GLScene::SceneLight_*>_>::vector
            ((vector<CGL::GLScene::SceneLight_*,_std::allocator<CGL::GLScene::SceneLight_*>_> *)
             0x178df1);
  std::vector<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>::vector
            ((vector<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_> *)
             0x178dfe);
  Vector3D::Vector3D((Vector3D *)&local_78.field_0);
  Vector3D::Vector3D((Vector3D *)&local_a8.field_0);
  sVar6 = std::vector<CGL::Collada::Node,_std::allocator<CGL::Collada::Node>_>::size(local_18);
  local_ac = (int)sVar6;
  for (local_b0 = 0; local_b0 < local_ac; local_b0 = local_b0 + 1) {
    local_b8 = std::vector<CGL::Collada::Node,_std::allocator<CGL::Collada::Node>_>::operator[]
                         (local_18,(long)local_b0);
    local_c0 = (MaterialInfo *)local_b8->instance;
    pMVar12 = &local_b8->transform;
    local_c8 = (Application *)pMVar12;
    switch((local_c0->super_Instance).type) {
    case CAMERA:
      local_50 = local_c0;
      Vector4D::Vector4D(local_128,(Vector3D *)&local_78.field_0,1.0);
      Matrix4x4::operator*
                ((Matrix4x4 *)in_stack_fffffffffffffdb8,(Vector4D *)in_stack_fffffffffffffdb0);
      Vector4D::to3D(in_stack_fffffffffffffca8);
      local_78.field_0.x = local_e8;
      local_78.field_0.y = dStack_e0;
      local_78.field_0.z = dStack_d8;
      local_78._24_8_ = uStack_d0;
      in_stack_fffffffffffffcf8 = local_c8;
      Vector4D::Vector4D(local_1a8,(Vector3D *)(local_50 + 1),1.0);
      Matrix4x4::operator*
                ((Matrix4x4 *)in_stack_fffffffffffffdb8,(Vector4D *)in_stack_fffffffffffffdb0);
      Vector4D::to3D(in_stack_fffffffffffffca8);
      Vector3D::unit((Vector3D *)in_stack_fffffffffffffcc8);
      local_a8.field_0.x = local_148;
      local_a8.field_0.y = dStack_140;
      local_a8.field_0.z = dStack_138;
      local_a8._24_8_ = uStack_130;
      init_camera(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
      in_stack_fffffffffffffd00 = pMVar12;
      break;
    case LIGHT:
      in_stack_fffffffffffffcf0 =
           (LightInfo *)
           init_light(in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,
                      (Matrix4x4 *)in_stack_fffffffffffffce8);
      std::vector<CGL::GLScene::SceneLight_*,_std::allocator<CGL::GLScene::SceneLight_*>_>::
      push_back((vector<CGL::GLScene::SceneLight_*,_std::allocator<CGL::GLScene::SceneLight_*>_> *)
                in_stack_fffffffffffffcb0,(value_type *)in_stack_fffffffffffffca8);
      break;
    case SPHERE:
      in_stack_fffffffffffffce8 =
           (BBox *)init_sphere(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                               in_stack_fffffffffffffe10);
      std::vector<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>::
      push_back((vector<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_> *
                )in_stack_fffffffffffffcb0,(value_type *)in_stack_fffffffffffffca8);
      break;
    case POLYMESH:
      in_stack_fffffffffffffce0 =
           (Scene *)init_polymesh((Application *)
                                  CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
                                  in_stack_fffffffffffffcc8,(Matrix4x4 *)in_stack_fffffffffffffcc0);
      std::vector<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>::
      push_back((vector<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_> *
                )in_stack_fffffffffffffcb0,(value_type *)in_stack_fffffffffffffca8);
      break;
    case MATERIAL:
      init_material(in_RDI,local_c0);
    }
  }
  defaultStyle = (Scene *)operator_new(0x50);
  std::vector<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>::vector
            ((vector<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_> *)
             in_stack_fffffffffffffd00,
             (vector<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_> *)
             in_stack_fffffffffffffcf8);
  std::vector<CGL::GLScene::SceneLight_*,_std::allocator<CGL::GLScene::SceneLight_*>_>::vector
            ((vector<CGL::GLScene::SceneLight_*,_std::allocator<CGL::GLScene::SceneLight_*>_> *)
             in_stack_fffffffffffffd00,
             (vector<CGL::GLScene::SceneLight_*,_std::allocator<CGL::GLScene::SceneLight_*>_> *)
             in_stack_fffffffffffffcf8);
  GLScene::Scene::Scene
            ((Scene *)in_stack_fffffffffffffcf0,
             (vector<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_> *)
             in_stack_fffffffffffffce8,
             (vector<CGL::GLScene::SceneLight_*,_std::allocator<CGL::GLScene::SceneLight_*>_> *)
             in_stack_fffffffffffffce0);
  in_RDI->scene = defaultStyle;
  std::vector<CGL::GLScene::SceneLight_*,_std::allocator<CGL::GLScene::SceneLight_*>_>::~vector
            ((vector<CGL::GLScene::SceneLight_*,_std::allocator<CGL::GLScene::SceneLight_*>_> *)
             in_stack_fffffffffffffcc0);
  std::vector<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>::~vector
            ((vector<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_> *)
             in_stack_fffffffffffffcc0);
  GLScene::Scene::get_bbox((Scene *)in_stack_fffffffffffffd48);
  uVar5 = BBox::empty((BBox *)&stack0xfffffffffffffd98);
  if (!(bool)uVar5) {
    BBox::centroid(in_stack_fffffffffffffce8);
    in_stack_fffffffffffffcc8 = (PolymeshInfo *)Vector3D::norm((Vector3D *)0x179219);
    in_RDI->canonical_view_distance = (double)in_stack_fffffffffffffcc8 * 0.5 * 1.5;
    dVar1 = in_RDI->canonical_view_distance + in_RDI->canonical_view_distance;
    dVar7 = in_RDI->canonical_view_distance / 10.0;
    dVar2 = in_RDI->canonical_view_distance * 20.0;
    in_stack_fffffffffffffcc0 = (Application *)&in_RDI->canonicalCamera;
    Vector3D::Vector3D((Vector3D *)&stack0xfffffffffffffd38,&local_288);
    dVar8 = acos(local_a8.field_0.y);
    dVar9 = atan2(local_a8.field_0.x,local_a8.field_0.z);
    VVar3.field_0.field_0.y = (double)in_stack_fffffffffffffcb0;
    VVar3.field_0.field_0.x = (double)in_stack_fffffffffffffca8;
    VVar3.field_0.field_0.z = dVar8;
    VVar3.field_0._24_8_ = in_stack_fffffffffffffcc0;
    CGL::Camera::place(VVar3,dVar8,dVar9,dVar1,dVar7,dVar2);
    pCVar11 = &in_RDI->camera;
    Vector3D::Vector3D(&local_2e8,&local_288);
    dVar9 = acos(local_a8.field_0.y);
    dVar10 = atan2(local_a8.field_0.x,local_a8.field_0.z);
    VVar4.field_0.field_0.y = (double)pCVar11;
    VVar4.field_0.field_0.x = dVar9;
    VVar4.field_0.field_0.z = dVar8;
    VVar4.field_0._24_8_ = in_stack_fffffffffffffcc0;
    CGL::Camera::place(VVar4,dVar9,dVar10,dVar1,dVar7,dVar2);
    set_scroll_rate(in_RDI);
  }
  GLScene::Scene::set_draw_styles
            (in_stack_fffffffffffffce0,(DrawStyle *)defaultStyle,
             (DrawStyle *)CONCAT17(uVar5,in_stack_fffffffffffffcd0),
             (DrawStyle *)in_stack_fffffffffffffcc8);
  std::vector<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>::~vector
            ((vector<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_> *)
             in_stack_fffffffffffffcc0);
  std::vector<CGL::GLScene::SceneLight_*,_std::allocator<CGL::GLScene::SceneLight_*>_>::~vector
            ((vector<CGL::GLScene::SceneLight_*,_std::allocator<CGL::GLScene::SceneLight_*>_> *)
             in_stack_fffffffffffffcc0);
  return;
}

Assistant:

void Application::load(SceneInfo* sceneInfo) {

  vector<Collada::Node>& nodes = sceneInfo->nodes;
  vector<GLScene::SceneLight *> lights;
  vector<GLScene::SceneObject *> objects;

  // save camera position to update camera control later
  CameraInfo *c;
  Vector3D c_pos = Vector3D();
  Vector3D c_dir = Vector3D();

  int len = nodes.size();
  for (int i = 0; i < len; i++) {
    Collada::Node& node = nodes[i];
    Collada::Instance *instance = node.instance;
    const Matrix4x4& transform = node.transform;

    switch(instance->type) {
      case Collada::Instance::CAMERA:
        c = static_cast<CameraInfo*>(instance);
        c_pos = (transform * Vector4D(c_pos,1)).to3D();
        c_dir = (transform * Vector4D(c->view_dir,1)).to3D().unit();
        init_camera(*c, transform);
        break;
      case Collada::Instance::LIGHT:
      {
        lights.push_back(
          init_light(static_cast<LightInfo&>(*instance), transform));
        break;
      }
      case Collada::Instance::SPHERE:
        objects.push_back(
          init_sphere(static_cast<SphereInfo&>(*instance), transform));
        break;
      case Collada::Instance::POLYMESH:
        objects.push_back(
          init_polymesh(static_cast<PolymeshInfo&>(*instance), transform));
        break;
      case Collada::Instance::MATERIAL:
        init_material(static_cast<MaterialInfo&>(*instance));
        break;
     }
  }

  scene = new GLScene::Scene(objects, lights);

  const BBox& bbox = scene->get_bbox();
  if (!bbox.empty()) {

    Vector3D target = bbox.centroid();
    canonical_view_distance = bbox.extent.norm() / 2 * 1.5;

    double view_distance = canonical_view_distance * 2;
    double min_view_distance = canonical_view_distance / 10.0;
    double max_view_distance = canonical_view_distance * 20.0;

    canonicalCamera.place(target,
                          acos(c_dir.y),
                          atan2(c_dir.x, c_dir.z),
                          view_distance,
                          min_view_distance,
                          max_view_distance);

    camera.place(target,
                acos(c_dir.y),
                atan2(c_dir.x, c_dir.z),
                view_distance,
                min_view_distance,
                max_view_distance);

    set_scroll_rate();
  }

  // set default draw styles for meshEdit -
  scene->set_draw_styles(&defaultStyle, &hoverStyle, &selectStyle);

}